

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O1

void lsvm::system::run(void)

{
  ulong uVar1;
  timespec local_18;
  
  uVar1 = run_time_slice();
  if ((long)uVar1 < 5000) {
    local_18.tv_sec = 0;
    local_18.tv_nsec = 10000000;
    nanosleep(&local_18,(timespec *)0x0);
    puts("sleep");
  }
  printf("%d\n",uVar1 & 0xffffffff);
  return;
}

Assistant:

void run(){
    //printf("%p %d\n",processes,processes_count);
    clock_t clocks = run_time_slice();
    if(clocks < max_time_slice_half){
        sleep(10);
        printf("sleep\n");
    }
    printf("%d\n",(int)clocks);
    //printf("%p %d\n",processes,processes_count);
}